

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O2

void __thiscall
mapbox::detail::Earcut<unsigned_int>::earcutLinked(Earcut<unsigned_int> *this,Node *ear,int pass)

{
  Node *__args;
  Node *start;
  bool bVar1;
  Node *pNVar2;
  
  while( true ) {
    while( true ) {
      if (ear == (Node *)0x0) {
        return;
      }
      pNVar2 = ear;
      if ((pass == 0) && (this->hashing == true)) {
        indexCurve(this,ear);
      }
      do {
        while( true ) {
          __args = ear->prev;
          start = ear->next;
          if (__args == start) {
            return;
          }
          if (this->hashing == true) {
            bVar1 = isEarHashed(this,ear);
          }
          else {
            bVar1 = isEar(this,ear);
          }
          if (bVar1 == false) break;
          std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,&__args->i);
          std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,&ear->i);
          std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,&start->i);
          removeNode(this,ear);
          ear = start->next;
          pNVar2 = ear;
        }
        ear = start;
      } while (start != pNVar2);
      if (pass != 0) break;
      ear = filterPoints(this,start,(Node *)0x0);
      pass = 1;
    }
    if (pass != 1) break;
    pNVar2 = filterPoints(this,start,(Node *)0x0);
    ear = cureLocalIntersections(this,pNVar2);
    pass = 2;
  }
  if (pass != 2) {
    return;
  }
  splitEarcut(this,start);
  return;
}

Assistant:

void Earcut<N>::earcutLinked(Node* ear, int pass) {
    if (!ear) return;

    // interlink polygon nodes in z-order
    if (!pass && hashing) indexCurve(ear);

    Node* stop = ear;
    Node* prev;
    Node* next;

    int iterations = 0;

    // iterate through ears, slicing them one by one
    while (ear->prev != ear->next) {
        iterations++;
        prev = ear->prev;
        next = ear->next;

        if (hashing ? isEarHashed(ear) : isEar(ear)) {
            // cut off the triangle
            indices.emplace_back(prev->i);
            indices.emplace_back(ear->i);
            indices.emplace_back(next->i);

            removeNode(ear);

            // skipping the next vertice leads to less sliver triangles
            ear = next->next;
            stop = next->next;

            continue;
        }

        ear = next;

        // if we looped through the whole remaining polygon and can't find any more ears
        if (ear == stop) {
            // try filtering points and slicing again
            if (!pass) earcutLinked(filterPoints(ear), 1);

            // if this didn't work, try curing all small self-intersections locally
            else if (pass == 1) {
                ear = cureLocalIntersections(filterPoints(ear));
                earcutLinked(ear, 2);

            // as a last resort, try splitting the remaining polygon into two
            } else if (pass == 2) splitEarcut(ear);

            break;
        }
    }
}